

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_reportRowVecSol
          (HModel *this,int nrow,vector<double,_std::allocator<double>_> *XrowLower,
          vector<double,_std::allocator<double>_> *XrowUpper,
          vector<double,_std::allocator<double>_> *XrowPrimal,
          vector<double,_std::allocator<double>_> *XrowDual,
          vector<int,_std::allocator<int>_> *XrowStatus)

{
  double dVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  reference pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  int row;
  uint local_34;
  
  if (0 < in_ESI) {
    printf("Row    St      Primal       Lower       Upper        Dual\n");
    for (local_34 = 0; (int)local_34 < in_ESI; local_34 = local_34 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_stack_00000008,(long)(int)local_34);
      if (*pvVar5 == 1) {
        printf("%6d BC",(ulong)local_34);
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (in_stack_00000008,(long)(int)local_34);
        if (*pvVar5 == 3) {
          printf("%6d FR",(ulong)local_34);
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_00000008,(long)(int)local_34);
          if (*pvVar5 == 0) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_RDX,(long)(int)local_34);
            dVar1 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_RCX,(long)(int)local_34);
            if ((dVar1 != *pvVar6) || (NAN(dVar1) || NAN(*pvVar6))) {
              printf("%6d LB",(ulong)local_34);
            }
            else {
              printf("%6d FX",(ulong)local_34);
            }
          }
          else {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_00000008,(long)(int)local_34);
            if (*pvVar5 == 2) {
              printf("%6d UB",(ulong)local_34);
            }
            else {
              printf("%6d ??",(ulong)local_34);
            }
          }
        }
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)(int)local_34);
      vVar2 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)(int)local_34);
      vVar3 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)(int)local_34);
      vVar4 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,(long)(int)local_34);
      printf(" %11g %11g %11g %11g\n",vVar2,vVar3,vVar4,*pvVar6);
    }
  }
  return;
}

Assistant:

void HModel::util_reportRowVecSol(int nrow, vector<double>& XrowLower, vector<double>& XrowUpper,
			      vector<double>& XrowPrimal, vector<double>& XrowDual, vector<int>& XrowStatus) {
  // Report the LP row data and solution passed to the method, where
  // XrowStatus is the SCIP-like basis status
  if (nrow <= 0) return;
  printf("Row    St      Primal       Lower       Upper        Dual\n");
  for (int row = 0; row < nrow; row++) {
    if (XrowStatus[row] == HSOL_BASESTAT_BASIC)
      printf("%6d BC", row);
    else if (XrowStatus[row] == HSOL_BASESTAT_ZERO)
      printf("%6d FR", row);
    else if (XrowStatus[row] == HSOL_BASESTAT_LOWER) {
      if (XrowLower[row] == XrowUpper[row])
	printf("%6d FX", row);
      else
	printf("%6d LB", row);
    }
    else if (XrowStatus[row] == HSOL_BASESTAT_UPPER)
      printf("%6d UB", row);
    else
      printf("%6d ??", row);
    printf(" %11g %11g %11g %11g\n", XrowPrimal[row], XrowLower[row], XrowUpper[row], XrowDual[row]);
  }
}